

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

NetType cfd::core::GetNetworkTypeFromVersion(uint32_t version)

{
  NetType NVar1;
  KeyFormatData local_88;
  uint32_t local_c;
  uint32_t version_local;
  
  local_c = version;
  GetKeyFormatFromVersion(&local_88,version);
  NVar1 = KeyFormatData::GetNetType(&local_88);
  KeyFormatData::~KeyFormatData(&local_88);
  return NVar1;
}

Assistant:

static NetType GetNetworkTypeFromVersion(uint32_t version) {
  return GetKeyFormatFromVersion(version).GetNetType();
}